

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void re2c::output_types(ostream *o,uint32_t ind,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *types)

{
  ostream *poVar1;
  opt_t *poVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint32_t ind_00;
  string local_90;
  string local_70;
  uint local_50;
  uint i;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *types_local;
  ostream *poStack_10;
  uint32_t ind_local;
  ostream *o_local;
  
  types_local._4_4_ = ind + 1;
  local_20 = types;
  poStack_10 = o;
  indent_abi_cxx11_(&local_40,(re2c *)(ulong)ind,(uint32_t)types);
  poVar1 = std::operator<<(o,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"enum ");
  poVar2 = Opt::operator->((Opt *)&opts);
  poVar1 = std::operator<<(poVar1,(string *)&poVar2->yycondtype);
  std::operator<<(poVar1," {\n");
  std::__cxx11::string::~string((string *)&local_40);
  local_50 = 0;
  while( true ) {
    uVar3 = (ulong)local_50;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    poVar1 = poStack_10;
    if (sVar4 <= uVar3) break;
    indent_abi_cxx11_(&local_70,(re2c *)(ulong)types_local._4_4_,ind_00);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar2 = Opt::operator->((Opt *)&opts);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->condEnumPrefix);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)local_50);
    poVar1 = std::operator<<(poVar1,(string *)pvVar5);
    std::operator<<(poVar1,",\n");
    std::__cxx11::string::~string((string *)&local_70);
    local_50 = local_50 + 1;
  }
  types_local._4_4_ = types_local._4_4_ - 1;
  indent_abi_cxx11_(&local_90,(re2c *)(ulong)types_local._4_4_,ind_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"};\n");
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void output_types (std::ostream & o, uint32_t ind, const std::vector<std::string> & types)
{
	o << indent (ind++) << "enum " << opts->yycondtype << " {\n";
	for (unsigned int i = 0; i < types.size (); ++i)
	{
		o << indent (ind) << opts->condEnumPrefix << types[i] << ",\n";
	}
	o << indent (--ind) << "};\n";
}